

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

intptr_t http_listen(char *port,char *binding,http_settings_s arg_settings)

{
  fio_listen_args args;
  http_settings_s arg_settings_00;
  undefined1 auVar1 [120];
  http_settings_s *phVar2;
  intptr_t iVar3;
  _func_void_http_s_ptr *local_e8;
  _func_void_intptr_t_void_ptr *p_Var4;
  http_settings_s *settings;
  char *binding_local;
  char *port_local;
  
  auVar1 = (undefined1  [120])arg_settings._8_120_;
  if (arg_settings.on_request == (_func_void_http_s_ptr *)0x0) {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: http_listen requires the .on_request parameter to be set\n");
    }
    kill(0,2);
    exit(0xb);
  }
  local_e8 = arg_settings.on_request;
  arg_settings_00._120_8_ = &local_e8;
  arg_settings_00._0_120_ = auVar1;
  p_Var4 = (_func_void_intptr_t_void_ptr *)arg_settings.max_header_size;
  phVar2 = http_settings_new(arg_settings_00);
  phVar2->is_client = '\0';
  if (phVar2->tls != (void *)0x0) {
    fio_tls_alpn_add(phVar2->tls,"http/1.1",http_on_server_protocol_http1,(void *)0x0,
                     (_func_void_void_ptr *)0x0);
  }
  local_e8 = http_on_open;
  args.port = binding;
  args.on_open = (_func_void_intptr_t_void_ptr *)port;
  args.address = (char *)arg_settings.tls;
  args.tls = phVar2;
  args.udata = (void *)0x0;
  args.on_start = http_on_finish;
  args.on_finish = p_Var4;
  iVar3 = fio_listen(args);
  return iVar3;
}

Assistant:

intptr_t http_listen(const char *port, const char *binding,
                     struct http_settings_s arg_settings) {
  if (arg_settings.on_request == NULL) {
    FIO_LOG_ERROR("http_listen requires the .on_request parameter "
                  "to be set\n");
    kill(0, SIGINT);
    exit(11);
  }

  http_settings_s *settings = http_settings_new(arg_settings);
  settings->is_client = 0;
  if (settings->tls) {
    fio_tls_alpn_add(settings->tls, "http/1.1", http_on_server_protocol_http1,
                     NULL, NULL);
  }

  return fio_listen(.port = port, .address = binding, .tls = arg_settings.tls,
                    .on_finish = http_on_finish, .on_open = http_on_open,
                    .udata = settings);
}